

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

Matcher<const_pstore::small_vector<int,_2UL>_&> * __thiscall
testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_pstore::small_vector<int,_2UL>_&> *__return_storage_ptr__,
          ElementsAreMatcher *this)

{
  ElementsAreMatcherImpl<pstore::small_vector<int,2ul>const&> *this_00;
  undefined4 *puVar1;
  MatcherVec matchers;
  IterateOverTuple<std::tuple<int>,_1UL> local_29;
  vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_> local_28;
  
  local_28.
  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (Matcher<const_int_&> *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matcher<const_int_&> *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
  reserve(&local_28,1);
  TransformTupleValuesHelper<std::tuple<int>,_testing::internal::CastAndAppendTransform<const_int_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>_>
  ::IterateOverTuple<std::tuple<int>,_1UL>::operator()(&local_29,this,&local_28);
  this_00 = (ElementsAreMatcherImpl<pstore::small_vector<int,2ul>const&> *)operator_new(0x20);
  ElementsAreMatcherImpl<pstore::small_vector<int,2ul>const&>::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<int_const&>*,std::vector<testing::Matcher<int_const&>,std::allocator<testing::Matcher<int_const&>>>>>
            (this_00,(__normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
                      )local_28.
                       super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
              )local_28.
               super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->super_MatcherBase<const_pstore::small_vector<int,_2UL>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0024c5e0;
  (__return_storage_ptr__->super_MatcherBase<const_pstore::small_vector<int,_2UL>_&>).vtable_ =
       (VTable *)
       MatcherBase<pstore::small_vector<int,2ul>const&>::
       GetVTable<testing::internal::MatcherBase<pstore::small_vector<int,2ul>const&>::ValuePolicy<testing::MatcherInterface<pstore::small_vector<int,2ul>const&>const*,true>>()
       ::kVTable;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(ElementsAreMatcherImpl<pstore::small_vector<int,2ul>const&> **)(puVar1 + 2) = this_00;
  (__return_storage_ptr__->super_MatcherBase<const_pstore::small_vector<int,_2UL>_&>).buffer_.ptr =
       puVar1;
  (__return_storage_ptr__->super_MatcherBase<const_pstore::small_vector<int,_2UL>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0024c570;
  std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
  ~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    GTEST_COMPILE_ASSERT_(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value ||
            ::std::tuple_size<MatcherTuple>::value < 2,
        use_UnorderedElementsAre_with_hash_tables);

    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&> > MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers.begin(), matchers.end()));
  }